

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O1

int rtr_send_error_pdu_from_host
              (rtr_socket *rtr_socket,void *erroneous_pdu,uint32_t erroneous_pdu_len,
              pdu_error_type error,char *err_text,uint32_t err_text_len)

{
  long lVar1;
  uint32_t err_text_len_00;
  undefined1 *__dest;
  long in_FS_OFFSET;
  undefined8 uStack_50;
  undefined1 auStack_48 [12];
  uint32_t local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = -((ulong)erroneous_pdu_len + 0xf & 0xfffffffffffffff0);
  __dest = auStack_48 + lVar1;
  local_3c = err_text_len;
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x109282;
  memcpy(__dest,erroneous_pdu,(ulong)erroneous_pdu_len);
  if (erroneous_pdu_len != 8) {
    if (erroneous_pdu_len < 9) goto LAB_001092b6;
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x109294;
    rtr_pdu_convert_footer_byte_order(__dest,TO_NETWORK_BYTE_ORDER);
  }
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x10929e;
  rtr_pdu_convert_header_byte_order(__dest,TO_NETWORK_BYTE_ORDER);
  err_text_len_00 = local_3c;
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1092b6;
  rtr_send_error_pdu(rtr_socket,__dest,erroneous_pdu_len,error,err_text,err_text_len_00);
LAB_001092b6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  *(code **)((long)&uStack_50 + lVar1) = rtr_sync_receive_and_store_pdus;
  __stack_chk_fail();
}

Assistant:

static int rtr_send_error_pdu_from_host(const struct rtr_socket *rtr_socket, const void *erroneous_pdu,
					const uint32_t erroneous_pdu_len, const enum pdu_error_type error,
					const char *err_text, const uint32_t err_text_len)
{
	char pdu[erroneous_pdu_len];

	memcpy(&pdu, erroneous_pdu, erroneous_pdu_len);

	if (erroneous_pdu_len == sizeof(struct pdu_header))
		rtr_pdu_header_to_network_byte_order(&pdu);
	else if (erroneous_pdu_len > sizeof(struct pdu_header))
		rtr_pdu_to_network_byte_order(&pdu);
	else
		return RTR_ERROR;

	return rtr_send_error_pdu(rtr_socket, &pdu, erroneous_pdu_len, error, err_text, err_text_len);
}